

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O3

bool __thiscall storage::BTree::_search_(BTree *this,int key,Record **out)

{
  bool bVar1;
  int iVar2;
  BTInnerNode *this_00;
  BTLeafNode *this_01;
  BTNode *pBVar3;
  BTNode *node;
  BTNode *local_40;
  int local_34;
  
  pBVar3 = this->root_;
  if (pBVar3 == (BTNode *)0x0) {
    bVar1 = false;
  }
  else {
    local_40 = pBVar3;
    iVar2 = (**pBVar3->_vptr_BTNode)(pBVar3);
    if ((char)iVar2 == '\0') {
      do {
        this_00 = (BTInnerNode *)__dynamic_cast(pBVar3,&BTNode::typeinfo,&BTInnerNode::typeinfo,0);
        BTInnerNode::search_node(this_00,key,&local_40);
        pBVar3 = local_40;
        iVar2 = (**local_40->_vptr_BTNode)(local_40);
      } while ((char)iVar2 == '\0');
    }
    this_01 = (BTLeafNode *)__dynamic_cast(pBVar3,&BTNode::typeinfo,&BTLeafNode::typeinfo,0);
    bVar1 = BTLeafNode::search_record(this_01,key,out,&local_34);
  }
  return bVar1;
}

Assistant:

bool BTree::_search_(int key, Record *&out) {
        if (!root_)
            return false;
        BTNode *node = root_;
        while (!node->is_leaf_node()) {
            dynamic_cast<BTInnerNode *>(node)->search_node(key, node);
        }
        int index = -1;
        return dynamic_cast<BTLeafNode *>(node)->search_record(key, out, index);
    }